

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_compare(lua_State *L,int index1,int index2,int op)

{
  int iVar1;
  TValue *l;
  TValue *r;
  
  l = index2addr(L,index1);
  r = index2addr(L,index2);
  if (r != &luaO_nilobject_ && l != &luaO_nilobject_) {
    if (op == 2) {
      iVar1 = luaV_lessequal(L,l,r);
      return iVar1;
    }
    if (op == 1) {
      iVar1 = luaV_lessthan(L,l,r);
      return iVar1;
    }
    if (op == 0) {
      iVar1 = luaV_equalobj(L,l,r);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

LUA_API int lua_compare (lua_State *L, int index1, int index2, int op) {
  StkId o1, o2;
  int i = 0;
  lua_lock(L);  /* may call tag method */
  o1 = index2addr(L, index1);
  o2 = index2addr(L, index2);
  if (isvalid(o1) && isvalid(o2)) {
    switch (op) {
      case LUA_OPEQ: i = luaV_equalobj(L, o1, o2); break;
      case LUA_OPLT: i = luaV_lessthan(L, o1, o2); break;
      case LUA_OPLE: i = luaV_lessequal(L, o1, o2); break;
      default: api_check(L, 0, "invalid option");
    }
  }
  lua_unlock(L);
  return i;
}